

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  bool bVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  size_type sVar5;
  uint *puVar6;
  ostream *this;
  mapped_type *s;
  iterator local_90;
  size_type local_88;
  _Self local_80;
  _Self local_78;
  int local_70;
  int i;
  uint local_5c;
  int local_58;
  int last_answer;
  int seq;
  int y;
  int x;
  int op;
  int q;
  int n;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dyn;
  
  dyn._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)&q);
  local_5c = 0;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&op);
  std::istream::operator>>(piVar2,&x);
  for (local_70 = 0; local_70 < x; local_70 = local_70 + 1) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&y);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&seq);
    std::istream::operator>>(piVar2,&last_answer);
    local_58 = (int)(seq ^ local_5c) % op;
    if (y == 1) {
      local_78._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)&q,&local_58);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&q);
      bVar1 = std::operator==(&local_78,&local_80);
      if (bVar1) {
        s._4_4_ = last_answer;
        local_90 = (iterator)((long)&s + 4);
        local_88 = 1;
        pmVar3 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&q,&local_58);
        __l._M_len = local_88;
        __l._M_array = local_90;
        std::vector<int,_std::allocator<int>_>::operator=(pmVar3,__l);
      }
      else {
        pmVar3 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&q,&local_58);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar3,&last_answer);
      }
    }
    else {
      pmVar3 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)&q,&local_58);
      uVar4 = (ulong)last_answer;
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pmVar3);
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pmVar3,uVar4 % sVar5);
      local_5c = *puVar6;
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_5c);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  }
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)&q);
  return dyn._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main() {
  std::map<int, std::vector<int>> dyn;
  int n, q, op, x, y, seq, last_answer = 0;
  std::cin >> n >> q;
  for (int i = 0; i < q; ++i) {
    std::cin >> op >> x >> y;
    seq = (x ^ last_answer) % n;
    if (op == 1) {
      if (dyn.find(seq) == dyn.end()) {
        dyn[seq] = {y};
      } else {
        dyn[seq].push_back(y);
      }
    } else {
      const auto &s = dyn[seq];
      last_answer = s[y % s.size()];
      std::cout << last_answer << std::endl;
    }
  }
}